

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O3

void __thiscall optimization::inlineFunc::Rewriter::cast_block(Rewriter *this,BasicBlk *blk)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  int iVar1;
  mapped_type mVar2;
  uint32_t uVar3;
  MirFunction *pMVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  Rewriter *this_01;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_02;
  mapped_type *pmVar7;
  BasicBlk *pBVar8;
  char cVar9;
  uint uVar10;
  mapped_type *pmVar11;
  _Rb_tree_node_base *p_Var12;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *__rhs;
  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> tVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_03;
  __uniq_ptr_data<mir::inst::Inst,_std::default_delete<mir::inst::Inst>,_true,_true> _Var14;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar15;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var16;
  _Base_ptr p_Var17;
  uint32_t *puVar18;
  JumpKind JVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  undefined **ppuVar22;
  _func_int **pp_Var23;
  pointer *__ptr;
  int iVar24;
  pointer puVar25;
  char *function;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var26;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var27;
  Displayable DVar28;
  Inst *pIVar29;
  _Rb_tree_header *p_Var30;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _val;
  int bb_true;
  mapped_type new_id;
  int bb_false;
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  char cStack_330;
  RegisterShiftKind RStack_32f;
  uint8_t uStack_32e;
  Rewriter *local_328;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_320;
  undefined1 local_318 [8];
  variant<int,_mir::inst::VarId> vStack_310;
  __index_type local_2f8;
  pointer local_2f0;
  _func_int **local_2e8;
  _func_int **local_2e0;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_2d8;
  Displayable local_2d0;
  uint32_t local_2c4;
  anon_class_8_1_a78179b7_conflict local_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [16];
  _Variadic_union<int,_mir::inst::VarId> local_2a0;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_290;
  _Base_ptr local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_270 [8];
  bool local_268;
  mapped_type *local_220;
  VarId local_218;
  undefined1 local_208;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [16];
  _Variadic_union<int,_mir::inst::VarId> _Stack_1d0;
  _Variadic_union<int,_mir::inst::VarId> *local_1c0;
  _Variadic_union<int,_mir::inst::VarId> *local_1b8;
  size_t local_1b0;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  vStack_1a8;
  Displayable local_190;
  JumpInstructionKind local_188;
  bool local_170;
  undefined8 local_168;
  JumpKind local_160;
  BasicBlk *local_150;
  _func_int **local_148;
  _func_int **local_140;
  _func_int **local_138;
  _func_int **local_130;
  _func_int **local_128;
  _func_int **local_120;
  pointer local_118;
  Value local_110;
  undefined1 local_f0 [24];
  char local_d8;
  undefined2 local_d7;
  Value local_d0;
  Value local_b0;
  Value local_90;
  Value local_70;
  Value local_50;
  
  local_200 = &this->label_cast_map;
  pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (local_200,&blk->id);
  local_1f8._12_4_ = *pmVar11;
  pMVar4 = this->func;
  local_1e8 = (undefined1  [8])&PTR_display_001ed448;
  auStack_1e0._0_4_ = local_1f8._12_4_;
  local_1c0 = &_Stack_1d0;
  auStack_1e0._8_8_ = 0;
  _Stack_1d0._0_8_ = 0;
  _Stack_1d0._8_8_ = 0;
  local_1b0 = 0;
  vStack_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190._vptr_Displayable = (_func_int **)&PTR_display_001ed408;
  local_188 = Undefined;
  local_170 = false;
  local_168._0_4_ = -1;
  local_168._4_4_ = -1;
  local_160 = Undefined;
  local_2b8._0_4_ = local_1f8._12_4_;
  local_1b8 = local_1c0;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)local_2b0,(BasicBlk *)local_1e8);
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_emplace_unique<std::pair<int,mir::inst::BasicBlk>>
            ((_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
              *)&pMVar4->basic_blks,(pair<int,_mir::inst::BasicBlk> *)local_2b8);
  local_2b0._0_8_ = &PTR_display_001ed448;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_270);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_2a0._M_first);
  local_1e8 = (undefined1  [8])&PTR_display_001ed448;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&vStack_1a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (auStack_1e0 + 8));
  _Var26._M_head_impl = (Inst *)(local_1f8 + 0xc);
  local_220 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(&this->func->basic_blks,(key_type *)_Var26._M_head_impl);
  p_Var12 = (blk->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var30 = &(blk->preceding)._M_t._M_impl.super__Rb_tree_header;
  local_150 = blk;
  if ((_Rb_tree_header *)p_Var12 != p_Var30) {
    this_00 = &local_220->preceding;
    do {
      local_2b8._0_4_ = p_Var12[1]._M_color;
      pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                          (local_200,(key_type *)local_2b8);
      iVar1 = *pmVar11;
      if (iVar1 == this->sub_starttId) {
        iVar1 = this->cur_blkId;
      }
      local_1e8._0_4_ = iVar1;
      _Var26._M_head_impl = (Inst *)local_1e8;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00
                 ,(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8)->_M_local_buf);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var30);
  }
  puVar25 = (local_150->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_118 = (local_150->inst).
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_328 = this;
  if (puVar25 != local_118) {
    local_320 = &this->var_cast_map;
    local_2d8 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                 *)&local_220->inst;
    ppuVar22 = &PTR_display_001ecfe8;
    local_120 = (_func_int **)&PTR_display_001ed048;
    local_140 = (_func_int **)&PTR_display_001ed168;
    local_130 = (_func_int **)&PTR_display_001ed288;
    local_138 = (_func_int **)&PTR_display_001ed348;
    local_128 = (_func_int **)&PTR_display_001ed108;
    local_148 = (_func_int **)&PTR_display_001ed3a8;
    local_2e8 = (_func_int **)&PTR_display_001ecfe8;
    local_2e0 = (_func_int **)&PTR_display_001ed1c8;
    local_2d0._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
    do {
      uVar10 = (*(((puVar25->_M_t).
                   super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable)
                 ._vptr_Displayable[1])();
      DVar28._vptr_Displayable = local_2d0._vptr_Displayable;
      pp_Var23 = local_2e0;
      this_02 = local_320;
      if (7 < uVar10) {
        local_2c0.__lhs =
             (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)
             ((ulong)local_2c0.__lhs & 0xffffffffffffff00);
        AixLog::operator<<((ostream *)&local_2c0,(Severity *)_Var26._M_head_impl);
        local_1e8 = (undefined1  [8])&PTR__Tag_001eaf88;
        auStack_1e0._0_8_ = &_Stack_1d0;
        auStack_1e0._8_8_ = 0;
        _Stack_1d0._0_8_ = _Stack_1d0._0_8_ & 0xffffffffffffff00;
        local_1c0 = (_Variadic_union<int,_mir::inst::VarId> *)CONCAT71(local_1c0._1_7_,1);
        AixLog::operator<<((ostream *)local_1e8,(Tag *)_Var26._M_head_impl);
        local_218._8_8_ = std::chrono::_V2::system_clock::now();
        local_218.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001eaf58;
        local_208 = 0;
        AixLog::operator<<((ostream *)&local_218,(Timestamp *)_Var26._M_head_impl);
        local_318 = (undefined1  [8])
                    ((long)&vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                            super__Move_assign_alias<int,_mir::inst::VarId>.
                            super__Copy_assign_alias<int,_mir::inst::VarId>.
                            super__Move_ctor_alias<int,_mir::inst::VarId>.
                            super__Copy_ctor_alias<int,_mir::inst::VarId>.
                            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"cast_block","");
        local_348._0_8_ = (long)local_348 + 0x10;
        function = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                   ,"");
        local_2b8 = (undefined1  [8])&PTR__Function_001eafb8;
        DVar28._vptr_Displayable =
             (_func_int **)
             ((long)&vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
        local_2b0._0_8_ = &local_2a0;
        if (local_318 != (undefined1  [8])DVar28._vptr_Displayable) {
          local_2b0._0_8_ = local_318;
        }
        local_2a0._0_8_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_;
        local_2b0._8_8_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ & 0xffffffffffffff00;
        local_290._M_head_impl = (Inst *)&local_280;
        if (local_348._0_8_ != (long)local_348 + 0x10) {
          local_290._M_head_impl = (Inst *)local_348._0_8_;
        }
        local_280._M_allocated_capacity._1_7_ = local_338._1_7_;
        local_280._M_local_buf[0] = local_338[0];
        local_288 = (_Base_ptr)local_348._8_8_;
        local_348._8_8_ = 0;
        local_338[0] = 0;
        local_270 = (undefined1  [8])0xc5;
        local_268 = false;
        local_348._0_8_ = (long)local_348 + 0x10;
        local_318 = (undefined1  [8])DVar28._vptr_Displayable;
        AixLog::operator<<((ostream *)local_2b8,(Function *)function);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"error!",6);
        cVar9 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
        _Var26._M_head_impl = (Inst *)(ulong)(uint)(int)cVar9;
        std::ostream::put(-0x80);
        std::ostream::flush();
        AixLog::Function::~Function((Function *)local_2b8);
        if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
          _Var26._M_head_impl = (Inst *)(CONCAT71(local_338._1_7_,local_338[0]) + 1);
          operator_delete((void *)local_348._0_8_,(ulong)_Var26._M_head_impl);
        }
        if (local_318 !=
            (undefined1  [8])
            ((long)&vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8)) {
          _Var26._M_head_impl =
               (Inst *)(vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ + 1);
          operator_delete((void *)local_318,(ulong)_Var26._M_head_impl);
        }
        local_1e8 = (undefined1  [8])&PTR__Tag_001eaf88;
        if ((_Variadic_union<int,_mir::inst::VarId> *)auStack_1e0._0_8_ == &_Stack_1d0)
        goto LAB_00125547;
        _Var26._M_head_impl = (Inst *)(_Stack_1d0._0_8_ + 1);
        DVar28._vptr_Displayable = (_func_int **)auStack_1e0._0_8_;
        goto LAB_00125542;
      }
      pIVar29 = (puVar25->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      switch(uVar10) {
      case 0:
        if ((pIVar29->super_Displayable)._vptr_Displayable != (_func_int **)ppuVar22) {
          pIVar29 = (Inst *)0x0;
        }
        local_2b8._0_4_ = (pIVar29->dest).id;
        local_2f0 = puVar25;
        puVar18 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        local_2c4 = *puVar18;
        local_90._24_1_ = *(undefined1 *)&pIVar29[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_90.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_90._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar29[1].dest);
        DVar28._vptr_Displayable = local_2d0._vptr_Displayable;
        local_90.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_90._25_2_ = *(undefined2 *)((long)&pIVar29[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_1e8,local_328,&local_90);
        tVar13.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
        super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
             operator_new(0x38);
        pp_Var23 = local_2e8;
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar28._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))->
        super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        *(uint32_t *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = local_2c4;
        *(_func_int ***)
         tVar13.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
         super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pp_Var23;
        local_318 = (undefined1  [8])
                    ((long)tVar13.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)tVar13.
                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x30))->
        _M_local_buf[0] = local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        (((Value *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18))->
        super_Displayable)._vptr_Displayable = DVar28._vptr_Displayable;
        *(undefined2 *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x31) =
             local_2a0._M_first._M_storage._1_2_;
        _Var26._M_head_impl = (Inst *)local_348;
        local_348._0_8_ =
             tVar13.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_348);
        ppuVar22 = local_2e8;
        puVar25 = local_2f0;
        _Var27._M_head_impl = (Inst *)local_348._0_8_;
        if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_348._0_8_
            == (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) break;
        goto LAB_00124e9f;
      case 1:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_120) {
          pIVar29 = (Inst *)0x0;
        }
        local_2b8._0_4_ = (pIVar29->dest).id;
        puVar18 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        uVar3 = *puVar18;
        local_50._24_1_ = *(undefined1 *)&pIVar29[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_50.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_50._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar29[1].dest);
        DVar28._vptr_Displayable = local_2d0._vptr_Displayable;
        this_01 = local_328;
        local_50.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_50._25_2_ = *(undefined2 *)((long)&pIVar29[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_318,local_328,&local_50);
        local_70._24_1_ = *(undefined1 *)&pIVar29[3].dest.super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_70.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_70._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar29[2].dest.id);
        local_70.super_Displayable._vptr_Displayable = DVar28._vptr_Displayable;
        local_70._25_2_ =
             *(undefined2 *)((long)&pIVar29[3].dest.super_Displayable._vptr_Displayable + 1);
        cast_value((Value *)local_348,this_01,&local_70);
        this_03 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x60);
        local_218.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_218.id = uVar3;
        local_2a0._M_rest._0_1_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_2c0.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_2c0,&vStack_310);
        local_2b8 = (undefined1  [8])DVar28._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        _Stack_1d0._M_rest._0_1_ = cStack_330;
        local_2c0.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)auStack_1e0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)cStack_330 + 1]._M_data)
                  (&local_2c0,(variant<int,_mir::inst::VarId> *)(local_348 + 8));
        local_1e8 = (undefined1  [8])DVar28._vptr_Displayable;
        _Stack_1d0._M_first._M_storage._1_1_ = RStack_32f;
        _Stack_1d0._M_first._M_storage._2_1_ = uStack_32e;
        mir::inst::OpInst::OpInst
                  ((OpInst *)this_03,&local_218,(Value *)local_2b8,(Value *)local_1e8,
                   pIVar29[3].dest.id);
        _Var26._M_head_impl = (Inst *)local_1f8;
        local_1f8._0_8_ = this_03;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   _Var26._M_head_impl);
        _Var27._M_head_impl = (Inst *)local_1f8._0_8_;
        goto joined_r0x00124e99;
      case 2:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_140) {
          pIVar29 = (Inst *)0x0;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1e8,
                          (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(pIVar29 + 1));
        local_318 = (undefined1  [8])&PTR_display_001eb100;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
             (_Uninitialized<int,_true>)0xffffffff;
        local_2f8 = '\0';
        if (_Stack_1d0._8_1_ == '\0') {
          pvVar15 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1e8);
          local_348._0_4_ = pvVar15->id;
          pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::at(local_320,(key_type *)local_348);
          local_2b8 = (undefined1  [8])&PTR_display_001eb100;
          local_2b0._0_4_ = *pmVar11;
          std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                    ((variant<mir::inst::VarId,std::__cxx11::string> *)local_318,(VarId *)local_2b8)
          ;
        }
        else {
          __rhs = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1e8);
          std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                    ((variant<mir::inst::VarId,std::__cxx11::string> *)local_318,__rhs);
        }
        local_2b8._0_4_ = (pIVar29->dest).id;
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        mVar2 = *pmVar11;
        _Var16._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
             (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)operator_new(0x40);
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_2b8,
                          (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_318);
        *(undefined ***)
         ((long)_Var16._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) =
             &PTR_display_001eb100;
        *(mapped_type *)
         ((long)_Var16._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = mVar2;
        *(_func_int ***)
         _Var16._M_t.
         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
         super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_140;
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)_Var16._M_t.
                                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                             0x18),(_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_2b8);
        local_218.super_Displayable._vptr_Displayable =
             (_func_int **)
             _Var16._M_t.
             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_2b8);
        local_348._0_8_ = local_218.super_Displayable._vptr_Displayable;
        local_218.super_Displayable._vptr_Displayable = (_func_int **)0x0;
        _Var26._M_head_impl = (Inst *)local_348;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_348);
        ppuVar22 = local_2e8;
        if ((_Head_base<0UL,_mir::inst::Inst_*,_false>)local_348._0_8_ !=
            (_Head_base<0UL,_mir::inst::Inst_*,_false>)0x0) {
          (**(code **)(*(long *)local_348._0_8_ + 0x28))();
        }
        local_348._0_8_ =
             (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0;
        std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   &local_218);
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_318);
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1e8);
        break;
      case 3:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_2e0) {
          pIVar29 = (Inst *)0x0;
        }
        local_b0._24_1_ = *(undefined1 *)&pIVar29[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_b0.field_0x8;
        local_2f0 = puVar25;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_b0._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar29[1].dest);
        DVar28._vptr_Displayable = local_2d0._vptr_Displayable;
        local_b0.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_b0._25_2_ = *(undefined2 *)((long)&pIVar29[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_1e8,local_328,&local_b0);
        local_2b8._0_4_ = (pIVar29->dest).id;
        puVar18 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        uVar3 = *puVar18;
        tVar13.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
        super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
             operator_new(0x38);
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar28._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))->
        super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        *(uint32_t *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = uVar3;
        *(_func_int ***)
         tVar13.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
         super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pp_Var23;
        local_318 = (undefined1  [8])
                    ((long)tVar13.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)tVar13.
                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x30))->
        _M_local_buf[0] = local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        (((Value *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18))->
        super_Displayable)._vptr_Displayable = DVar28._vptr_Displayable;
        *(undefined2 *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x31) =
             local_2a0._M_first._M_storage._1_2_;
        _Var26._M_head_impl = (Inst *)local_348;
        local_348._0_8_ =
             tVar13.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_348);
        puVar25 = local_2f0;
        ppuVar22 = local_2e8;
        if ((_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
            local_348._0_8_ != (Inst *)0x0) {
          (**(code **)(*(size_type *)local_348._0_8_ + 0x28))();
          ppuVar22 = local_2e8;
        }
        break;
      case 4:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_130) {
          pIVar29 = (Inst *)0x0;
        }
        local_d0._24_1_ = *(undefined1 *)&pIVar29[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_d0.field_0x8;
        local_2f0 = puVar25;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_d0._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar29[1].dest);
        local_d0.super_Displayable._vptr_Displayable = DVar28._vptr_Displayable;
        local_d0._25_2_ = *(undefined2 *)((long)&pIVar29[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_1e8,local_328,&local_d0);
        local_2b8._0_4_ = (pIVar29->dest).id;
        puVar18 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        uVar3 = *puVar18;
        _Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
        super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
             (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)
             operator_new(0x38);
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar28._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))->
        super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        *(uint32_t *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = uVar3;
        *(_func_int ***)
         _Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
         super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_130;
        local_318 = (undefined1  [8])
                    ((long)_Var14.
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20);
        *(undefined1 *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x30) =
             local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        (((Value *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18))->
        super_Displayable)._vptr_Displayable = DVar28._vptr_Displayable;
        *(undefined2 *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x31) =
             local_2a0._M_first._M_storage._1_2_;
        _Var26._M_head_impl = (Inst *)local_348;
        local_348._0_8_ =
             _Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
             _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_348);
        puVar25 = local_2f0;
        _Var27._M_head_impl = (Inst *)local_348._0_8_;
        goto joined_r0x00124e99;
      case 5:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_138) {
          pIVar29 = (Inst *)0x0;
        }
        local_2b8._0_4_ = (pIVar29->dest).id;
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        local_2f0 = (pointer)CONCAT44(local_2f0._4_4_,*pmVar11);
        local_2b8._0_4_ = *(int *)&pIVar29[1].dest.super_Displayable._vptr_Displayable;
        puVar18 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(this_02,(key_type *)local_2b8);
        local_2c4 = *puVar18;
        local_110._24_1_ = SUB41(pIVar29[2].dest.id,0);
        local_2b8 = (undefined1  [8])&local_110.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_110._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)(pIVar29 + 2));
        DVar28._vptr_Displayable = local_2d0._vptr_Displayable;
        local_110.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_110._25_2_ = *(undefined2 *)((long)&pIVar29[2].dest.id + 1);
        cast_value((Value *)local_1e8,local_328,&local_110);
        _Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
        super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
             (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)
             operator_new(0x48);
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar28._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))->
        super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        *(uint32_t *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) =
             (uint32_t)local_2f0;
        *(_func_int ***)
         _Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
         super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_138;
        (((Value *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18))->
        super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        *(uint32_t *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20) = local_2c4;
        local_318 = (undefined1  [8])
                    ((long)_Var14.
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x30);
        *(undefined1 *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x40) =
             local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        *(_func_int ***)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x28) =
             DVar28._vptr_Displayable;
        *(undefined2 *)
         ((long)_Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                ._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x41) =
             local_2a0._M_first._M_storage._1_2_;
        _Var26._M_head_impl = (Inst *)local_348;
        local_348._0_8_ =
             _Var14.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
             _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_348);
        _Var27._M_head_impl = (Inst *)local_348._0_8_;
joined_r0x00124e99:
        ppuVar22 = local_2e8;
        if (_Var27._M_head_impl != (Inst *)0x0) {
LAB_00124e9f:
          ppuVar22 = local_2e8;
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(_Var27._M_head_impl)->super_Displayable)->_M_allocated_capacity + 0x28)
          )();
        }
        break;
      case 6:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_128) {
          pIVar29 = (Inst *)0x0;
        }
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
        local_318 = (undefined1  [8])0x0;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
        pp_Var5 = *(_func_int ***)&pIVar29[2].dest.id;
        local_2f0 = puVar25;
        for (pp_Var23 = pIVar29[2].dest.super_Displayable._vptr_Displayable; pp_Var23 != pp_Var5;
            pp_Var23 = pp_Var23 + 4) {
          local_2a0._1_7_ = (int7)((ulong)local_2a0._0_8_ >> 8);
          local_2a0._M_rest._0_1_ = *(char *)(pp_Var23 + 3);
          local_1e8 = (undefined1  [8])local_2b0;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
            ::_S_vtable._M_arr[(long)*(char *)(pp_Var23 + 3) + 1]._M_data)
                    ((anon_class_8_1_a78179b7_conflict *)local_1e8,
                     (variant<int,_mir::inst::VarId> *)(pp_Var23 + 1));
          local_2b8 = (undefined1  [8])local_2d0._vptr_Displayable;
          local_2a0._M_first._M_storage._1_2_ = *(undefined2 *)((long)pp_Var23 + 0x19);
          local_d8 = local_2a0._M_rest._0_1_;
          local_348._0_8_ = local_f0 + 8;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
            ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                    ((anon_class_8_1_a78179b7_conflict *)local_348,
                     (variant<int,_mir::inst::VarId> *)local_2b0);
          local_f0._0_8_ = local_2d0._vptr_Displayable;
          local_d7 = local_2a0._M_first._M_storage._1_2_;
          cast_value((Value *)local_1e8,local_328,(Value *)local_f0);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
          emplace_back<mir::inst::Value>
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_318,
                     (Value *)local_1e8);
        }
        local_218.super_Displayable._vptr_Displayable._0_4_ = (pIVar29->dest).id;
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)&local_218);
        local_2b8 = (undefined1  [8])&PTR_display_001eb100;
        local_2b0._0_4_ = *pmVar11;
        std::
        make_unique<mir::inst::CallInst,mir::inst::VarId,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                  ((VarId *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)(pIVar29 + 1));
        local_1e8 = (undefined1  [8])local_348._0_8_;
        local_348._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        _Var26._M_head_impl = (Inst *)local_1e8;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   _Var26._M_head_impl);
        ppuVar22 = local_2e8;
        puVar25 = local_2f0;
        if (local_1e8 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_1e8 + 0x28))();
        }
        local_1e8 = (undefined1  [8])0x0;
        std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                   local_348);
        DVar28._vptr_Displayable = (_func_int **)local_318;
        uVar6 = vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_;
        goto joined_r0x001251cc;
      case 7:
        if ((pIVar29->super_Displayable)._vptr_Displayable != local_148) {
          pIVar29 = (Inst *)0x0;
        }
        auStack_1e0._8_8_ = 0;
        local_1e8 = (undefined1  [8])0x0;
        auStack_1e0._0_8_ = (_Variadic_union<int,_mir::inst::VarId> *)0x0;
        pp_Var5 = pIVar29[2].super_Displayable._vptr_Displayable;
        for (pp_Var23 = *(_func_int ***)&pIVar29[1].dest.id; pp_Var23 != pp_Var5;
            pp_Var23 = pp_Var23 + 2) {
          local_318._0_4_ = *(undefined4 *)(pp_Var23 + 1);
          pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::at(local_320,(key_type *)local_318);
          local_2b8 = (undefined1  [8])&PTR_display_001eb100;
          local_2b0._0_4_ = *pmVar11;
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
          emplace_back<mir::inst::VarId>
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_1e8,
                     (VarId *)local_2b8);
        }
        local_2b8._0_4_ = (pIVar29->dest).id;
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        mVar2 = *pmVar11;
        _Var26._M_head_impl = (Inst *)operator_new(0x40);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2b8,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_1e8);
        ppuVar22 = local_2e8;
        *(undefined ***)((long)_Var26._M_head_impl + 8) = &PTR_display_001eb100;
        *(mapped_type *)((long)_Var26._M_head_impl + 0x10) = mVar2;
        *(_func_int ***)_Var26._M_head_impl = local_148;
        *(undefined ***)((long)_Var26._M_head_impl + 0x18) = &PTR_display_001eb100;
        *(mapped_type *)((long)_Var26._M_head_impl + 0x20) = mVar2;
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   ((long)_Var26._M_head_impl + 0x28),
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2b8);
        if (local_2b8 != (undefined1  [8])0x0) {
          local_348._0_8_ = _Var26._M_head_impl;
          operator_delete((void *)local_2b8,local_2b0._8_8_ - (long)local_2b8);
          _Var26._M_head_impl = (Inst *)local_348._0_8_;
        }
        local_348._0_8_ =
             (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0;
        local_318 = (undefined1  [8])_Var26._M_head_impl;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2d8,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_318);
        if (local_318 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_318 + 0x28))();
        }
        local_318 = (undefined1  [8])0x0;
        _Var26._M_head_impl = (Inst *)local_348._0_8_;
        DVar28._vptr_Displayable = (_func_int **)local_1e8;
        uVar6 = auStack_1e0._8_8_;
        if ((_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
            local_348._0_8_ != (Inst *)0x0) {
          std::default_delete<mir::inst::PhiInst>::operator()
                    ((default_delete<mir::inst::PhiInst> *)local_348,(PhiInst *)local_348._0_8_);
          DVar28._vptr_Displayable = (_func_int **)local_1e8;
          uVar6 = auStack_1e0._8_8_;
        }
joined_r0x001251cc:
        if ((_Variadic_union<int,_mir::inst::VarId> *)DVar28._vptr_Displayable !=
            (_Variadic_union<int,_mir::inst::VarId> *)0x0) {
          _Var26._M_head_impl = (Inst *)(uVar6 - (long)DVar28._vptr_Displayable);
LAB_00125542:
          operator_delete(DVar28._vptr_Displayable,(ulong)_Var26._M_head_impl);
        }
      }
LAB_00125547:
      puVar25 = puVar25 + 1;
    } while (puVar25 != local_118);
  }
  pBVar8 = local_150;
  pmVar7 = local_220;
  iVar1 = (local_150->jump).bb_true;
  iVar24 = (local_150->jump).bb_false;
  p_Var17 = (local_328->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_2b8._0_4_ = iVar1;
  local_1e8._0_4_ = iVar24;
  if (p_Var17 != (_Base_ptr)0x0) {
    p_Var30 = &(local_328->label_cast_map)._M_t._M_impl.super__Rb_tree_header;
    p_Var21 = &p_Var30->_M_header;
    p_Var20 = p_Var17;
    do {
      if (iVar1 <= (int)p_Var20[1]._M_color) {
        p_Var21 = p_Var20;
      }
      p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < iVar1];
    } while (p_Var20 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var21 != p_Var30) && ((int)p_Var21[1]._M_color <= iVar1)) {
      pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                          (local_200,(key_type *)local_2b8);
      local_2b8._0_4_ = *pmVar11;
      p_Var17 = (local_328->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    p_Var20 = &p_Var30->_M_header;
    if (p_Var17 != (_Base_ptr)0x0) {
      do {
        if (iVar24 <= (int)p_Var17[1]._M_color) {
          p_Var20 = p_Var17;
        }
        p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < iVar24];
      } while (p_Var17 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var20 != p_Var30) && ((int)p_Var20[1]._M_color <= iVar24)) {
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_200,(key_type *)local_1e8);
        iVar24 = *pmVar11;
        local_1e8._0_4_ = iVar24;
      }
    }
  }
  if ((pBVar8->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
    local_318._0_4_ =
         (pBVar8->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
         super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
    puVar18 = (uint32_t *)
              std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                        (&local_328->var_cast_map,(key_type *)local_318);
    uVar3 = *puVar18;
    JVar19 = (pBVar8->jump).jump_kind;
    (pmVar7->jump).kind = (pBVar8->jump).kind;
    iVar24 = local_1e8._0_4_;
    if ((pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
      (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar3;
      (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    }
    else {
      (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar3;
    }
  }
  else {
    JVar19 = (pBVar8->jump).jump_kind;
    (pmVar7->jump).kind = (pBVar8->jump).kind;
    if ((pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) {
      (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
    }
  }
  (pmVar7->jump).bb_true = local_2b8._0_4_;
  (pmVar7->jump).bb_false = iVar24;
  (pmVar7->jump).jump_kind = JVar19;
  return;
}

Assistant:

void cast_block(mir::inst::BasicBlk& blk) {
    auto new_id = label_cast_map.at(blk.id);
    func.basic_blks.insert(std::make_pair(new_id, mir::inst::BasicBlk(new_id)));
    auto& new_blk = func.basic_blks.at(new_id);
    for (auto pre : blk.preceding) {
      auto new_pre = label_cast_map.at(pre);
      if (new_pre == sub_starttId) {
        new_pre = cur_blkId;
      }
      new_blk.preceding.insert(new_pre);
    }

    for (auto& inst : blk.inst) {
      auto kind = inst->inst_kind();
      auto& i = *inst;
      switch (kind) {
        case mir::inst::InstKind::Ref: {
          auto refInst = dynamic_cast<mir::inst::RefInst*>(&i);
          auto val = refInst->val;
          std::variant<mir::inst::VarId, std::string> _val;
          if (val.index() == 0) {
            _val = mir::inst::VarId(
                var_cast_map.at(std::get<mir::inst::VarId>(val).id));
          } else {
            _val = std::get<std::string>(val);
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::RefInst>(
              cast_varId(refInst->dest), _val));
          break;
        }
        case mir::inst::InstKind::Op: {
          auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
              cast_varId(opInst->dest), cast_value(opInst->lhs),
              cast_value(opInst->rhs), opInst->op));
          break;
        }
        case mir::inst::InstKind::Assign: {
          auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::AssignInst>(
              cast_varId(assignInst->dest), cast_value(assignInst->src)));
          break;
        }
        case mir::inst::InstKind::Load: {
          auto loadInst = dynamic_cast<mir::inst::LoadInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::LoadInst>(
              cast_value(loadInst->src), cast_varId(loadInst->dest)));
          break;
        }
        case mir::inst::InstKind::Store: {
          auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::StoreInst>(
              cast_value(storeInst->val), cast_varId(storeInst->dest)));
          break;
        }
        case mir::inst::InstKind::Call: {
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          std::vector<mir::inst::Value> paras;
          for (auto val : callInst->params) {
            paras.push_back(cast_value(val));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::CallInst>(
              cast_varId(callInst->dest), callInst->func, paras));
          break;
        }
        case mir::inst::InstKind::PtrOffset: {
          auto ptrInst = dynamic_cast<mir::inst::PtrOffsetInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::PtrOffsetInst>(
              cast_varId(ptrInst->dest), cast_varId(ptrInst->ptr),
              cast_value(ptrInst->offset)));
          break;
        }
        case mir::inst::InstKind::Phi: {
          auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
          std::vector<mir::inst::VarId> vars;
          for (auto vaR : phiInst->vars) {
            vars.push_back(cast_varId(vaR));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
              cast_varId(phiInst->dest), vars));
          break;
        }

        default:
          LOG(TRACE) << "error!" << std::endl;
      }
    }

    std::optional<mir::inst::VarId> cond_or_ret = {};
    auto bb_true = blk.jump.bb_true;
    auto bb_false = blk.jump.bb_false;
    if (label_cast_map.count(bb_true)) {
      bb_true = label_cast_map.at(bb_true);
      // if (bb_true == sub_endId) {
      //   bb_true = cur_blkId;
      // }
    }

    if (label_cast_map.count(bb_false)) {
      bb_false = label_cast_map.at(bb_false);
      // if (bb_false == sub_endId) {
      //   bb_false = cur_blkId;
      // }
    }

    if (blk.jump.cond_or_ret.has_value()) {
      cond_or_ret = blk.jump.cond_or_ret.value();
      cond_or_ret = mir::inst::VarId(var_cast_map.at(cond_or_ret.value().id));
    }
    new_blk.jump = mir::inst::JumpInstruction(blk.jump.kind, bb_true, bb_false,
                                              cond_or_ret, blk.jump.jump_kind);
  }